

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::ThreadDNSAddressSeed(CConnman *this)

{
  CThreadInterrupt *this_00;
  long lVar1;
  DNSLookupFn dns_lookup_function;
  CService ipIn;
  pointer pCVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  time_point tVar7;
  time_point tVar8;
  char *pcVar9;
  size_t sVar10;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar11;
  duration dVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  ulong uVar13;
  char *pcVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *pcVar15;
  pointer cip;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  undefined1 in_stack_fffffffffffffdf8 [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *strDest;
  uint32_t uVar16;
  pointer pbVar17;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_1d8;
  vector<CNetAddr,_std::allocator<CNetAddr>_> addresses;
  ServiceFlags requiredServiceBits;
  vector<CAddress,_std::allocator<CAddress>_> vAdd;
  int found;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seeds;
  CService local_160;
  CAddress addr;
  CNetAddr resolveSource;
  string host;
  FastRandomContext rng;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rng,"-seednode",(allocator<char> *)&addr);
  bVar3 = ArgsManager::IsArgSet(&gArgs,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  iVar5 = 0;
  if (bVar3) {
    tVar7 = NodeClock::now();
    rng.super_RandomMixin<FastRandomContext>.bitbuf = 0x1e;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "ThreadDNSAddressSeed";
    logging_function._M_len = 0x14;
    LogPrintFormatInternal<long>
              (logging_function,source_file,0x88f,ALL,Info,(ConstevalFormatString<1U>)0xc98e72,
               (long *)&rng);
    iVar5 = 0;
    do {
      bVar3 = CThreadInterrupt::operator_cast_to_bool(&this->interruptNet);
      if (bVar3) goto LAB_0070f08e;
      bVar3 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
      if (!bVar3) goto LAB_0070f199;
      tVar8 = NodeClock::now();
      if ((long)tVar7.__d.__r + 30000000000 < (long)tVar8.__d.__r) {
        pcVar9 = 
        "Couldn\'t connect to enough peers via seed nodes. Handing fetch logic to the DNS seeds.\n";
        iVar6 = 0x897;
        goto LAB_0070f084;
      }
      iVar5 = GetFullOutboundConnCount(this);
    } while (iVar5 < 2);
    pcVar9 = "P2P peers available. Finished fetching data from seed nodes.\n";
    iVar6 = 0x89d;
LAB_0070f084:
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "ThreadDNSAddressSeed";
    logging_function_00._M_len = 0x14;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,iVar6,ALL,Info,(ConstevalFormatString<0U>)pcVar9);
  }
LAB_0070f08e:
  FastRandomContext::FastRandomContext(&rng,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&seeds,&this->m_params->vSeeds);
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,FastRandomContext&>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )seeds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )seeds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&rng);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,"-forcednsseed",(allocator<char> *)&host);
  bVar3 = ArgsManager::GetBoolArg(&gArgs,(string *)&addr,false);
  std::__cxx11::string::~string((string *)&addr);
  if (!bVar3) {
    uVar13 = 0;
    sVar10 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    if (sVar10 != 0) goto LAB_0070f146;
  }
  uVar13 = (ulong)((long)seeds.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)seeds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 5;
LAB_0070f146:
  iVar6 = (int)uVar13;
  if ((iVar5 < 2) || (iVar6 != 0)) {
    uVar16 = (uint32_t)(uVar13 >> 0x20);
    found = 0;
    sVar10 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    pcVar9 = (char *)0x12c;
    if (sVar10 < 1000) {
      pcVar9 = (char *)0xb;
    }
    this_00 = &this->interruptNet;
    pbVar17 = seeds.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    while (seeds.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start != pbVar17) {
      args = seeds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if (iVar6 == 0) {
        sVar10 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
        iVar6 = 3;
        uVar16 = 0;
        args = seeds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        if (sVar10 != 0) {
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_04._M_len = 0x57;
          logging_function_04._M_str = "ThreadDNSAddressSeed";
          logging_function_04._M_len = 0x14;
          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = pcVar9;
          LogPrintFormatInternal<long>
                    (logging_function_04,source_file_04,0x8c8,ALL,Info,
                     (ConstevalFormatString<1U>)0xc98f68,(long *)&addr);
          pcVar14 = pcVar9;
          args = seeds.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          while (0 < (long)pcVar14) {
            pcVar15 = (char *)0xb;
            if (pcVar14 < (char *)0xb) {
              pcVar15 = pcVar14;
            }
            bVar3 = CThreadInterrupt::sleep_for(this_00,(duration)((long)pcVar15 * 1000000000));
            if (!bVar3) goto LAB_0070f17f;
            iVar5 = GetFullOutboundConnCount(this);
            pcVar14 = pcVar14 + -(long)pcVar15;
            if (1 < iVar5) {
              if (found < 1) {
                pcVar9 = "P2P peers available. Skipped DNS seeding.\n";
                iVar5 = 0x8d7;
              }
              else {
                source_file_05._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file_05._M_len = 0x57;
                logging_function_05._M_str = "ThreadDNSAddressSeed";
                logging_function_05._M_len = 0x14;
                LogPrintFormatInternal<int>
                          (logging_function_05,source_file_05,0x8d4,ALL,Info,
                           (ConstevalFormatString<1U>)0xc98f97,&found);
                pcVar9 = "P2P peers available. Finished DNS seeding.\n";
                iVar5 = 0x8d5;
              }
              source_file_07._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
              ;
              source_file_07._M_len = 0x57;
              logging_function_07._M_str = "ThreadDNSAddressSeed";
              logging_function_07._M_len = 0x14;
              LogPrintFormatInternal<>
                        (logging_function_07,source_file_07,iVar5,ALL,Info,
                         (ConstevalFormatString<0U>)pcVar9);
              goto LAB_0070f17f;
            }
          }
          iVar6 = 3;
          uVar16 = 0;
        }
      }
      bVar3 = CThreadInterrupt::operator_cast_to_bool(this_00);
      if (bVar3) goto LAB_0070f17f;
      strDest = args;
      if (((this->fNetworkActive)._M_base._M_i & 1U) == 0) {
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
        ;
        source_file_02._M_len = 0x57;
        logging_function_02._M_str = "ThreadDNSAddressSeed";
        logging_function_02._M_len = 0x14;
        LogPrintFormatInternal<>
                  (logging_function_02,source_file_02,0x8e3,ALL,Info,
                   (ConstevalFormatString<0U>)0xc99011);
        strDest = args;
        do {
          bVar3 = CThreadInterrupt::sleep_for(this_00,(duration)0x3b9aca00);
          if (!bVar3) goto LAB_0070f17f;
        } while (((this->fNetworkActive)._M_base._M_i & 1U) == 0);
      }
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8e9;
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file_03._M_len = 0x57;
      logging_function_03._M_str = "ThreadDNSAddressSeed";
      logging_function_03._M_len = 0x14;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_03,source_file_03,0x8e9,ALL,Info,
                 (ConstevalFormatString<1U>)0xc99053,args);
      bVar3 = HaveNameProxy();
      if (bVar3) {
        AddAddrFetch(this,strDest);
LAB_0070f565:
        iVar6 = iVar6 + -1;
        uVar16 = 0;
      }
      else {
        vAdd.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        vAdd.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        vAdd.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        requiredServiceBits = NODE_WITNESS|NODE_NETWORK;
        tinyformat::format<ServiceFlags,std::__cxx11::string>
                  (&host,(tinyformat *)"x%x.%s",(char *)&requiredServiceBits,(ServiceFlags *)strDest
                   ,args_1);
        CNetAddr::CNetAddr(&resolveSource);
        cVar4 = CNetAddr::SetInternal(&resolveSource,&host);
        iVar5 = 5;
        if ((bool)cVar4) {
          std::
          function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          ::function(&local_1d8,&g_dns_lookup_abi_cxx11_);
          dns_lookup_function.super__Function_base._M_functor._M_pod_data[0xf] = cVar4;
          dns_lookup_function.super__Function_base._M_functor._0_15_ = in_stack_fffffffffffffdf8;
          dns_lookup_function.super__Function_base._M_manager = (_Manager_type)strDest;
          dns_lookup_function._M_invoker._0_4_ = iVar6;
          dns_lookup_function._M_invoker._4_4_ = uVar16;
          LookupHost(&addresses,&host,0x20,true,dns_lookup_function);
          std::_Function_base::~_Function_base(&local_1d8.super__Function_base);
          pCVar2 = addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          cip = addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                super__Vector_impl_data._M_start;
          if (addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
              super__Vector_impl_data._M_start ==
              addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            AddAddrFetch(this,strDest);
          }
          else {
            for (; cip != pCVar2; cip = cip + 1) {
              CService::CService(&local_160,cip,this->m_params->nDefaultPort);
              ipIn.super_CNetAddr.m_addr._union.direct[0xf] = cVar4;
              ipIn.super_CNetAddr.m_addr._union._0_15_ = in_stack_fffffffffffffdf8;
              ipIn.super_CNetAddr.m_addr._16_8_ = strDest;
              ipIn.super_CNetAddr.m_net = iVar6;
              ipIn.super_CNetAddr.m_scope_id = uVar16;
              ipIn._32_8_ = pbVar17;
              CAddress::CAddress(&addr,ipIn,(ServiceFlags)&local_160);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_160);
              tVar11 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                                 ();
              dVar12 = RandomMixin<FastRandomContext>::
                       rand_uniform_duration<std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 (&rng.super_RandomMixin<FastRandomContext>,
                                  (duration)0xfffffffffffaba00);
              addr.nTime.__d.__r = (duration)(dVar12.__r + (long)tVar11.__d.__r + -0x3f480);
              std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&vAdd,&addr);
              found = found + 1;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
            }
            AddrMan::Add(this->addrman,&vAdd,&resolveSource,(seconds)0x0);
          }
          std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector(&addresses);
          iVar5 = 0;
        }
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&resolveSource.m_addr);
        std::__cxx11::string::~string((string *)&host);
        std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAdd);
        if (cVar4 != '\0') goto LAB_0070f565;
        if ((iVar5 != 5) && (iVar5 != 0)) goto LAB_0070f17f;
      }
      seeds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = strDest + 1;
    }
    source_file_06._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_06._M_len = 0x57;
    logging_function_06._M_str = "ThreadDNSAddressSeed";
    logging_function_06._M_len = 0x14;
    LogPrintFormatInternal<int>
              (logging_function_06,source_file_06,0x90d,ALL,Info,(ConstevalFormatString<1U>)0xc98f97
               ,&found);
  }
  else {
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_01._M_len = 0x57;
    logging_function_01._M_str = "ThreadDNSAddressSeed";
    logging_function_01._M_len = 0x14;
    LogPrintFormatInternal<>
              (logging_function_01,source_file_01,0x90f,ALL,Info,(ConstevalFormatString<0U>)0xc9907e
              );
  }
LAB_0070f17f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&seeds);
  ChaCha20::~ChaCha20(&rng.rng);
LAB_0070f199:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadDNSAddressSeed()
{
    int outbound_connection_count = 0;

    if (gArgs.IsArgSet("-seednode")) {
        auto start = NodeClock::now();
        constexpr std::chrono::seconds SEEDNODE_TIMEOUT = 30s;
        LogPrintf("-seednode enabled. Trying the provided seeds for %d seconds before defaulting to the dnsseeds.\n", SEEDNODE_TIMEOUT.count());
        while (!interruptNet) {
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;

            // Abort if we have spent enough time without reaching our target.
            // Giving seed nodes 30 seconds so this does not become a race against fixedseeds (which triggers after 1 min)
            if (NodeClock::now() > start + SEEDNODE_TIMEOUT) {
                LogPrintf("Couldn't connect to enough peers via seed nodes. Handing fetch logic to the DNS seeds.\n");
                break;
            }

            outbound_connection_count = GetFullOutboundConnCount();
            if (outbound_connection_count >= SEED_OUTBOUND_CONNECTION_THRESHOLD) {
                LogPrintf("P2P peers available. Finished fetching data from seed nodes.\n");
                break;
            }
        }
    }

    FastRandomContext rng;
    std::vector<std::string> seeds = m_params.DNSSeeds();
    std::shuffle(seeds.begin(), seeds.end(), rng);
    int seeds_right_now = 0; // Number of seeds left before testing if we have enough connections

    if (gArgs.GetBoolArg("-forcednsseed", DEFAULT_FORCEDNSSEED)) {
        // When -forcednsseed is provided, query all.
        seeds_right_now = seeds.size();
    } else if (addrman.Size() == 0) {
        // If we have no known peers, query all.
        // This will occur on the first run, or if peers.dat has been
        // deleted.
        seeds_right_now = seeds.size();
    }

    // Proceed with dnsseeds if seednodes hasn't reached the target or if forcednsseed is set
    if (outbound_connection_count < SEED_OUTBOUND_CONNECTION_THRESHOLD || seeds_right_now) {
        // goal: only query DNS seed if address need is acute
        // * If we have a reasonable number of peers in addrman, spend
        //   some time trying them first. This improves user privacy by
        //   creating fewer identifying DNS requests, reduces trust by
        //   giving seeds less influence on the network topology, and
        //   reduces traffic to the seeds.
        // * When querying DNS seeds query a few at once, this ensures
        //   that we don't give DNS seeds the ability to eclipse nodes
        //   that query them.
        // * If we continue having problems, eventually query all the
        //   DNS seeds, and if that fails too, also try the fixed seeds.
        //   (done in ThreadOpenConnections)
        int found = 0;
        const std::chrono::seconds seeds_wait_time = (addrman.Size() >= DNSSEEDS_DELAY_PEER_THRESHOLD ? DNSSEEDS_DELAY_MANY_PEERS : DNSSEEDS_DELAY_FEW_PEERS);

        for (const std::string& seed : seeds) {
            if (seeds_right_now == 0) {
                seeds_right_now += DNSSEEDS_TO_QUERY_AT_ONCE;

                if (addrman.Size() > 0) {
                    LogPrintf("Waiting %d seconds before querying DNS seeds.\n", seeds_wait_time.count());
                    std::chrono::seconds to_wait = seeds_wait_time;
                    while (to_wait.count() > 0) {
                        // if sleeping for the MANY_PEERS interval, wake up
                        // early to see if we have enough peers and can stop
                        // this thread entirely freeing up its resources
                        std::chrono::seconds w = std::min(DNSSEEDS_DELAY_FEW_PEERS, to_wait);
                        if (!interruptNet.sleep_for(w)) return;
                        to_wait -= w;

                        if (GetFullOutboundConnCount() >= SEED_OUTBOUND_CONNECTION_THRESHOLD) {
                            if (found > 0) {
                                LogPrintf("%d addresses found from DNS seeds\n", found);
                                LogPrintf("P2P peers available. Finished DNS seeding.\n");
                            } else {
                                LogPrintf("P2P peers available. Skipped DNS seeding.\n");
                            }
                            return;
                        }
                    }
                }
            }

            if (interruptNet) return;

            // hold off on querying seeds if P2P network deactivated
            if (!fNetworkActive) {
                LogPrintf("Waiting for network to be reactivated before querying DNS seeds.\n");
                do {
                    if (!interruptNet.sleep_for(std::chrono::seconds{1})) return;
                } while (!fNetworkActive);
            }

            LogPrintf("Loading addresses from DNS seed %s\n", seed);
            // If -proxy is in use, we make an ADDR_FETCH connection to the DNS resolved peer address
            // for the base dns seed domain in chainparams
            if (HaveNameProxy()) {
                AddAddrFetch(seed);
            } else {
                std::vector<CAddress> vAdd;
                constexpr ServiceFlags requiredServiceBits{SeedsServiceFlags()};
                std::string host = strprintf("x%x.%s", requiredServiceBits, seed);
                CNetAddr resolveSource;
                if (!resolveSource.SetInternal(host)) {
                    continue;
                }
                // Limit number of IPs learned from a single DNS seed. This limit exists to prevent the results from
                // one DNS seed from dominating AddrMan. Note that the number of results from a UDP DNS query is
                // bounded to 33 already, but it is possible for it to use TCP where a larger number of results can be
                // returned.
                unsigned int nMaxIPs = 32;
                const auto addresses{LookupHost(host, nMaxIPs, true)};
                if (!addresses.empty()) {
                    for (const CNetAddr& ip : addresses) {
                        CAddress addr = CAddress(CService(ip, m_params.GetDefaultPort()), requiredServiceBits);
                        addr.nTime = rng.rand_uniform_delay(Now<NodeSeconds>() - 3 * 24h, -4 * 24h); // use a random age between 3 and 7 days old
                        vAdd.push_back(addr);
                        found++;
                    }
                    addrman.Add(vAdd, resolveSource);
                } else {
                    // If the seed does not support a subdomain with our desired service bits,
                    // we make an ADDR_FETCH connection to the DNS resolved peer address for the
                    // base dns seed domain in chainparams
                    AddAddrFetch(seed);
                }
            }
            --seeds_right_now;
        }
        LogPrintf("%d addresses found from DNS seeds\n", found);
    } else {
        LogPrintf("Skipping DNS seeds. Enough peers have been found\n");
    }
}